

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffcpdt(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  long lVar2;
  LONGLONG outdatastart;
  LONGLONG indatastart;
  LONGLONG indataend;
  char buffer [2880];
  LONGLONG local_b90;
  long local_b88;
  long local_b80;
  undefined1 local_b78 [2888];
  
  if (*status < 1) {
    if (infptr == outfptr) {
      *status = 0x65;
      iVar1 = 0x65;
    }
    else {
      ffghadll(infptr,(LONGLONG *)0x0,&local_b88,&local_b80,status);
      ffghadll(outfptr,(LONGLONG *)0x0,&local_b90,(LONGLONG *)0x0,status);
      if (0xb3f < local_b80 - local_b88) {
        lVar2 = (local_b80 - local_b88) / 0xb40;
        if (infptr->Fptr == outfptr->Fptr) {
          do {
            ffmbyt(infptr,local_b88,0,status);
            ffgbyt(infptr,0xb40,local_b78,status);
            ffmbyt(outfptr,local_b90,1,status);
            ffpbyt(outfptr,0xb40,local_b78,status);
            local_b88 = local_b88 + 0xb40;
            local_b90 = local_b90 + 0xb40;
            lVar2 = lVar2 + -1;
          } while (lVar2 != 0);
        }
        else {
          ffmbyt(infptr,local_b88,0,status);
          ffmbyt(outfptr,local_b90,1,status);
          do {
            ffgbyt(infptr,0xb40,local_b78,status);
            ffpbyt(outfptr,0xb40,local_b78,status);
            lVar2 = lVar2 + -1;
          } while (lVar2 != 0);
        }
      }
      iVar1 = *status;
    }
    return iVar1;
  }
  return *status;
}

Assistant:

int ffcpdt(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
{
/*
  copy the data unit from the CHDU of infptr to the CHDU of outfptr. 
  This will overwrite any data already in the outfptr CHDU.
*/
    long nb, ii;
    LONGLONG indatastart, indataend, outdatastart;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghadll(infptr,  NULL, &indatastart, &indataend, status);
    ffghadll(outfptr, NULL, &outdatastart, NULL, status);

    /* Calculate the number of blocks to be copied  */
    nb = (long) ((indataend - indatastart) / 2880);

    if (nb > 0)
    {
      if (infptr->Fptr == outfptr->Fptr)
      {
        /* copying between 2 HDUs in the SAME file */
        for (ii = 0; ii < nb; ii++)
        {
            ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */

            ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */

            indatastart  += 2880; /* move address */
            outdatastart += 2880; /* move address */
        }
      }
      else
      {
        /* copying between HDUs in separate files */
        /* move to the initial copy position in each of the files */
        ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
        ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */
        }
      }
    }
    return(*status);
}